

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O3

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::process(Field<OpenMD::Vector3<double>_> *this)

{
  _func_int **pp_Var1;
  int iVar2;
  uint whichFrame;
  DumpReader reader;
  DumpReader DStack_1278;
  
  DumpReader::DumpReader
            (&DStack_1278,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar2 = DumpReader::getNFrames(&DStack_1278);
  this->nProcessed_ = iVar2 / (this->super_StaticAnalyser).step_;
  if (0 < iVar2) {
    whichFrame = 0;
    do {
      DumpReader::readFrame(&DStack_1278,whichFrame);
      pp_Var1 = (this->super_StaticAnalyser)._vptr_StaticAnalyser;
      this->snap_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      (*pp_Var1[4])(this,(ulong)whichFrame);
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_;
    } while ((int)whichFrame < iVar2);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this);
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[7])(this);
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[9])(this);
  DumpReader::~DumpReader(&DStack_1278);
  return;
}

Assistant:

void Field<T>::process() {
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      snap_ = info_->getSnapshotManager()->getCurrentSnapshot();
      processFrame(istep);
    }
    postProcess();
    writeField();
    writeVisualizationScript();
  }